

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall llvm::sys::path::parent_path(path *this,StringRef path,Style style)

{
  StringRef path_00;
  StringRef SVar1;
  unsigned_long *puVar2;
  path *ppVar3;
  size_t end_pos;
  path *ppStack_70;
  Style style_local;
  StringRef path_local;
  unsigned_long local_58;
  unsigned_long local_50;
  size_t local_48;
  unsigned_long local_40;
  undefined1 *local_38;
  
  path_local.Data = path.Data;
  path_00.Length = (size_t)path_local.Data;
  path_00.Data = (char *)this;
  ppStack_70 = this;
  local_48 = anon_unknown.dwarf_21af95::parent_path_end(path_00,(Style)path.Length);
  if (local_48 == 0xffffffffffffffff) {
    memset(&path_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&path_local.Length);
  }
  else {
    local_38 = (undefined1 *)&stack0xffffffffffffff90;
    local_40 = 0;
    puVar2 = std::min<unsigned_long>(&local_40,(unsigned_long *)&path_local);
    local_40 = *puVar2;
    ppVar3 = ppStack_70 + local_40;
    local_50 = (long)path_local.Data - local_40;
    puVar2 = std::min<unsigned_long>(&local_48,&local_50);
    local_58 = *puVar2;
    path_local.Length = (size_t)ppVar3;
  }
  SVar1.Length = local_58;
  SVar1.Data = (char *)path_local.Length;
  return SVar1;
}

Assistant:

StringRef parent_path(StringRef path, Style style) {
  size_t end_pos = parent_path_end(path, style);
  if (end_pos == StringRef::npos)
    return StringRef();
  else
    return path.substr(0, end_pos);
}